

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O1

REF_STATUS ref_recon_l2_projection_grad(REF_GRID ref_grid,REF_DBL *scalar,REF_DBL *grad)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  REF_STATUS RVar4;
  uint uVar5;
  uint uVar6;
  long *plVar7;
  long lVar8;
  undefined8 *puVar9;
  REF_CELL *ppRVar10;
  REF_NODE ref_node;
  ulong uVar11;
  long lVar12;
  undefined8 uVar13;
  void *unaff_RBX;
  REF_CELL pRVar14;
  REF_INT RVar15;
  size_t __size;
  int iVar16;
  REF_GRID pRVar17;
  REF_DBL *pRVar18;
  double dVar19;
  double dVar20;
  REF_DBL cell_vol;
  REF_DBL cell_grad [3];
  REF_BOOL div_by_zero;
  REF_INT tet_nodes [27];
  REF_INT nodes [27];
  double local_188;
  REF_DBL *local_180;
  REF_INT local_174;
  REF_INT local_170;
  REF_INT local_16c;
  REF_DBL local_168 [3];
  REF_INT local_14c;
  REF_INT local_148;
  REF_BOOL local_144;
  REF_CELL local_140;
  REF_NODE local_138;
  REF_GRID local_130;
  REF_INT local_128 [4];
  undefined4 uStack_118;
  uint local_bc;
  REF_INT local_b8 [4];
  REF_INT RStack_a8;
  REF_INT RStack_a4;
  REF_INT local_a0;
  undefined4 local_9c;
  REF_CELL *local_40;
  long local_38;
  
  local_138 = ref_grid->node;
  iVar16 = local_138->max;
  local_180 = scalar;
  if ((long)iVar16 < 0) {
    bVar3 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x34,
           "ref_recon_l2_projection_grad","malloc vol of REF_DBL negative");
    __size = 1;
  }
  else {
    __size = (long)iVar16 * 8;
    unaff_RBX = malloc(__size);
    if (unaff_RBX == (void *)0x0) {
      unaff_RBX = (void *)0x0;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x34,
             "ref_recon_l2_projection_grad","malloc vol of REF_DBL NULL");
      __size = 2;
      bVar3 = false;
    }
    else {
      bVar3 = true;
      if (iVar16 != 0) {
        memset(unaff_RBX,0,__size);
      }
    }
  }
  ref_node = local_138;
  uVar5 = (uint)__size;
  if (bVar3) {
    iVar16 = local_138->max;
    if (0 < (long)iVar16) {
      plVar7 = local_138->global;
      uVar11 = 0;
      do {
        if (-1 < *plVar7) {
          puVar9 = (undefined8 *)((long)grad + (uVar11 & 0x7fffffff8));
          *puVar9 = 0;
          puVar9[1] = 0;
          *(undefined8 *)((long)grad + (uVar11 & 0x7fffffff8) + 0x10) = 0;
        }
        uVar11 = uVar11 + 0x18;
        plVar7 = plVar7 + 1;
      } while ((long)iVar16 * 0x18 != uVar11);
    }
    local_130 = ref_grid;
    local_bc = uVar5;
    if (ref_grid->twod == 0) {
      local_40 = ref_grid->cell;
      ppRVar10 = ref_grid->cell + 8;
      lVar8 = 8;
      do {
        pRVar14 = *ppRVar10;
        local_38 = lVar8;
        if (0 < pRVar14->max) {
          RVar15 = 0;
          local_140 = pRVar14;
          do {
            RVar4 = ref_cell_nodes(pRVar14,RVar15,local_b8);
            if (RVar4 == 0) {
              switch(pRVar14->type) {
              case REF_CELL_EDG:
              case REF_CELL_ED2:
              case REF_CELL_ED3:
              case REF_CELL_TRI:
              case REF_CELL_TR2:
              case REF_CELL_TR3:
              case REF_CELL_QUA:
              case REF_CELL_QU2:
              case REF_CELL_TE2:
              case REF_CELL_PY2:
              case REF_CELL_PR2:
              case REF_CELL_HE2:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x15c,"ref_recon_l2_projection_grad",6,"implement cell type");
                printf("unknown type %d\n",(ulong)pRVar14->type);
                return 6;
              case REF_CELL_TET:
                uVar5 = ref_node_tet_vol(ref_node,local_b8,&local_188);
                uVar6 = ref_node_tet_grad_nodes(ref_node,local_b8,local_180,local_168);
                if (uVar5 == 0 && uVar6 == 0) {
                  lVar8 = 0;
                  do {
                    iVar16 = local_b8[lVar8];
                    lVar12 = 0;
                    do {
                      grad[(long)iVar16 * 3 + lVar12] =
                           local_168[lVar12] * local_188 + grad[(long)iVar16 * 3 + lVar12];
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 3);
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 4);
                  lVar8 = 0;
                  do {
                    *(double *)((long)unaff_RBX + (long)local_b8[lVar8] * 8) =
                         *(double *)((long)unaff_RBX + (long)local_b8[lVar8] * 8) + local_188;
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 4);
                }
                else {
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x7b,"ref_recon_l2_projection_grad",(ulong)uVar5,(ulong)uVar6);
                }
                break;
              case REF_CELL_PYR:
                local_128[0] = local_b8[0];
                local_128[1] = RStack_a8;
                uVar5 = ref_node_tet_vol(ref_node,local_128,&local_188);
                uVar6 = ref_node_tet_grad_nodes(ref_node,local_128,local_180,local_168);
                if (uVar5 == 0 && uVar6 == 0) {
                  lVar8 = 0;
                  do {
                    iVar16 = local_128[lVar8];
                    lVar12 = 0;
                    do {
                      grad[(long)iVar16 * 3 + lVar12] =
                           local_168[lVar12] * local_188 + grad[(long)iVar16 * 3 + lVar12];
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 3);
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 4);
                  lVar8 = 0;
                  do {
                    *(double *)((long)unaff_RBX + (long)local_128[lVar8] * 8) =
                         *(double *)((long)unaff_RBX + (long)local_128[lVar8] * 8) + local_188;
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 4);
                }
                else {
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0xc3,"ref_recon_l2_projection_grad",(ulong)uVar5,(ulong)uVar6);
                }
                local_128[0] = local_b8[0];
                local_128[1] = local_b8[3];
                local_128[2] = RStack_a8;
                local_128[3] = local_b8[2];
                uVar5 = ref_node_tet_vol(ref_node,local_128,&local_188);
                uVar6 = ref_node_tet_grad_nodes(ref_node,local_128,local_180,local_168);
                if (uVar5 == 0 && uVar6 == 0) {
                  lVar8 = 0;
                  do {
                    iVar16 = local_128[lVar8];
                    lVar12 = 0;
                    do {
                      grad[(long)iVar16 * 3 + lVar12] =
                           local_168[lVar12] * local_188 + grad[(long)iVar16 * 3 + lVar12];
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 3);
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 4);
                  lVar8 = 0;
                  do {
                    *(double *)((long)unaff_RBX + (long)local_128[lVar8] * 8) =
                         *(double *)((long)unaff_RBX + (long)local_128[lVar8] * 8) + local_188;
                    lVar8 = lVar8 + 1;
                    pRVar14 = local_140;
                  } while (lVar8 != 4);
                }
                else {
                  uVar13 = 0xd4;
LAB_001ea24d:
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,uVar13,"ref_recon_l2_projection_grad",(ulong)uVar5,(ulong)uVar6);
                  pRVar14 = local_140;
                }
                break;
              case REF_CELL_PRI:
                local_128[0] = local_b8[0];
                local_128[3] = local_b8[3];
                uVar5 = ref_node_tet_vol(ref_node,local_128,&local_188);
                uVar6 = ref_node_tet_grad_nodes(ref_node,local_128,local_180,local_168);
                if (uVar5 == 0 && uVar6 == 0) {
                  lVar8 = 0;
                  do {
                    iVar16 = local_128[lVar8];
                    lVar12 = 0;
                    do {
                      grad[(long)iVar16 * 3 + lVar12] =
                           local_168[lVar12] * local_188 + grad[(long)iVar16 * 3 + lVar12];
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 3);
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 4);
                  lVar8 = 0;
                  do {
                    *(double *)((long)unaff_RBX + (long)local_128[lVar8] * 8) =
                         *(double *)((long)unaff_RBX + (long)local_128[lVar8] * 8) + local_188;
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 4);
                }
                else {
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x8e,"ref_recon_l2_projection_grad",(ulong)uVar5,(ulong)uVar6);
                }
                uVar5 = ref_node_tet_vol(ref_node,local_128,&local_188);
                uVar6 = ref_node_tet_grad_nodes(ref_node,local_128,local_180,local_168);
                if (uVar5 == 0 && uVar6 == 0) {
                  lVar8 = 0;
                  do {
                    iVar16 = local_128[lVar8];
                    lVar12 = 0;
                    do {
                      grad[(long)iVar16 * 3 + lVar12] =
                           local_168[lVar12] * local_188 + grad[(long)iVar16 * 3 + lVar12];
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 3);
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 4);
                  lVar8 = 0;
                  do {
                    *(double *)((long)unaff_RBX + (long)local_128[lVar8] * 8) =
                         *(double *)((long)unaff_RBX + (long)local_128[lVar8] * 8) + local_188;
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 4);
                }
                else {
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x9f,"ref_recon_l2_projection_grad",(ulong)uVar5,(ulong)uVar6);
                }
                local_128[0] = local_b8[0];
                local_128[1] = local_b8[1];
                local_128[2] = local_b8[2];
                local_128[3] = RStack_a4;
                uVar5 = ref_node_tet_vol(ref_node,local_128,&local_188);
                uVar6 = ref_node_tet_grad_nodes(ref_node,local_128,local_180,local_168);
                if (uVar5 != 0 || uVar6 != 0) {
                  uVar13 = 0xb0;
                  goto LAB_001ea24d;
                }
                lVar8 = 0;
                do {
                  iVar16 = local_128[lVar8];
                  lVar12 = 0;
                  do {
                    grad[(long)iVar16 * 3 + lVar12] =
                         local_168[lVar12] * local_188 + grad[(long)iVar16 * 3 + lVar12];
                    lVar12 = lVar12 + 1;
                  } while (lVar12 != 3);
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 4);
                lVar8 = 0;
                do {
                  *(double *)((long)unaff_RBX + (long)local_128[lVar8] * 8) =
                       *(double *)((long)unaff_RBX + (long)local_128[lVar8] * 8) + local_188;
                  lVar8 = lVar8 + 1;
                  pRVar14 = local_140;
                } while (lVar8 != 4);
                break;
              case REF_CELL_HEX:
                local_16c = local_b8[0];
                local_148 = RStack_a8;
                local_170 = local_b8[1];
                local_128[0] = local_b8[1];
                local_14c = local_b8[3];
                local_128[1] = local_b8[3];
                local_174 = local_9c;
                local_128[2] = local_9c;
                local_128[3] = local_b8[2];
                uVar5 = ref_node_tet_vol(ref_node,local_128,&local_188);
                uVar6 = ref_node_tet_grad_nodes(ref_node,local_128,local_180,local_168);
                if (uVar5 == 0 && uVar6 == 0) {
                  lVar8 = 0;
                  do {
                    iVar16 = local_128[lVar8];
                    lVar12 = 0;
                    do {
                      grad[(long)iVar16 * 3 + lVar12] =
                           local_168[lVar12] * local_188 + grad[(long)iVar16 * 3 + lVar12];
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 3);
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 4);
                  lVar8 = 0;
                  do {
                    *(double *)((long)unaff_RBX + (long)local_128[lVar8] * 8) =
                         *(double *)((long)unaff_RBX + (long)local_128[lVar8] * 8) + local_188;
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 4);
                }
                else {
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0xef,"ref_recon_l2_projection_grad",(ulong)uVar5,(ulong)uVar6);
                }
                local_128[0] = local_170;
                local_128[1] = local_16c;
                local_128[2] = local_174;
                local_128[3] = local_14c;
                uVar5 = ref_node_tet_vol(ref_node,local_128,&local_188);
                uVar6 = ref_node_tet_grad_nodes(ref_node,local_128,local_180,local_168);
                if (uVar5 == 0 && uVar6 == 0) {
                  lVar8 = 0;
                  do {
                    iVar16 = local_128[lVar8];
                    lVar12 = 0;
                    do {
                      grad[(long)iVar16 * 3 + lVar12] =
                           local_168[lVar12] * local_188 + grad[(long)iVar16 * 3 + lVar12];
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 3);
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 4);
                  lVar8 = 0;
                  do {
                    *(double *)((long)unaff_RBX + (long)local_128[lVar8] * 8) =
                         *(double *)((long)unaff_RBX + (long)local_128[lVar8] * 8) + local_188;
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 4);
                }
                else {
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x100,"ref_recon_l2_projection_grad",(ulong)uVar5,(ulong)uVar6);
                }
                local_128[0] = local_170;
                local_128[1] = local_16c;
                local_128[2] = local_148;
                local_128[3] = local_174;
                uVar5 = ref_node_tet_vol(ref_node,local_128,&local_188);
                uVar6 = ref_node_tet_grad_nodes(ref_node,local_128,local_180,local_168);
                if (uVar5 == 0 && uVar6 == 0) {
                  lVar8 = 0;
                  do {
                    iVar16 = local_128[lVar8];
                    lVar12 = 0;
                    do {
                      grad[(long)iVar16 * 3 + lVar12] =
                           local_168[lVar12] * local_188 + grad[(long)iVar16 * 3 + lVar12];
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 3);
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 4);
                  lVar8 = 0;
                  do {
                    *(double *)((long)unaff_RBX + (long)local_128[lVar8] * 8) =
                         *(double *)((long)unaff_RBX + (long)local_128[lVar8] * 8) + local_188;
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 4);
                }
                else {
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x111,"ref_recon_l2_projection_grad",(ulong)uVar5,(ulong)uVar6);
                }
                local_16c = local_b8[1];
                local_170 = RStack_a8;
                local_148 = RStack_a4;
                local_14c = local_9c;
                local_128[1] = local_9c;
                local_174 = local_a0;
                local_128[2] = local_a0;
                local_128[3] = local_b8[2];
                uVar5 = ref_node_tet_vol(ref_node,local_128,&local_188);
                uVar6 = ref_node_tet_grad_nodes(ref_node,local_128,local_180,local_168);
                if (uVar5 == 0 && uVar6 == 0) {
                  lVar8 = 0;
                  do {
                    iVar16 = local_128[lVar8];
                    lVar12 = 0;
                    do {
                      grad[(long)iVar16 * 3 + lVar12] =
                           local_168[lVar12] * local_188 + grad[(long)iVar16 * 3 + lVar12];
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 3);
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 4);
                  lVar8 = 0;
                  do {
                    *(double *)((long)unaff_RBX + (long)local_128[lVar8] * 8) =
                         *(double *)((long)unaff_RBX + (long)local_128[lVar8] * 8) + local_188;
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 4);
                }
                else {
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x129,"ref_recon_l2_projection_grad",(ulong)uVar5,(ulong)uVar6);
                }
                local_128[0] = local_16c;
                local_128[1] = local_170;
                local_128[2] = local_174;
                local_128[3] = local_14c;
                uVar5 = ref_node_tet_vol(ref_node,local_128,&local_188);
                uVar6 = ref_node_tet_grad_nodes(ref_node,local_128,local_180,local_168);
                if (uVar5 == 0 && uVar6 == 0) {
                  lVar8 = 0;
                  do {
                    iVar16 = local_128[lVar8];
                    lVar12 = 0;
                    do {
                      grad[(long)iVar16 * 3 + lVar12] =
                           local_168[lVar12] * local_188 + grad[(long)iVar16 * 3 + lVar12];
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 3);
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 4);
                  lVar8 = 0;
                  do {
                    *(double *)((long)unaff_RBX + (long)local_128[lVar8] * 8) =
                         *(double *)((long)unaff_RBX + (long)local_128[lVar8] * 8) + local_188;
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 4);
                }
                else {
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x13a,"ref_recon_l2_projection_grad",(ulong)uVar5,(ulong)uVar6);
                }
                local_128[0] = local_16c;
                local_128[1] = local_170;
                local_128[2] = local_148;
                local_128[3] = local_174;
                uVar5 = ref_node_tet_vol(ref_node,local_128,&local_188);
                uVar6 = ref_node_tet_grad_nodes(ref_node,local_128,local_180,local_168);
                if (uVar5 != 0 || uVar6 != 0) {
                  uVar13 = 0x14b;
                  goto LAB_001ea24d;
                }
                lVar8 = 0;
                do {
                  iVar16 = local_128[lVar8];
                  lVar12 = 0;
                  do {
                    grad[(long)iVar16 * 3 + lVar12] =
                         local_168[lVar12] * local_188 + grad[(long)iVar16 * 3 + lVar12];
                    lVar12 = lVar12 + 1;
                  } while (lVar12 != 3);
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 4);
                lVar8 = 0;
                do {
                  *(double *)((long)unaff_RBX + (long)local_128[lVar8] * 8) =
                       *(double *)((long)unaff_RBX + (long)local_128[lVar8] * 8) + local_188;
                  lVar8 = lVar8 + 1;
                  pRVar14 = local_140;
                } while (lVar8 != 4);
              }
            }
            RVar15 = RVar15 + 1;
          } while (RVar15 < pRVar14->max);
        }
        ppRVar10 = local_40 + local_38 + 1;
        lVar8 = local_38 + 1;
      } while (lVar8 != 0x10);
    }
    else {
      pRVar14 = ref_grid->cell[3];
      if (0 < pRVar14->max) {
        iVar16 = 0;
        do {
          RVar4 = ref_cell_nodes(pRVar14,iVar16,local_b8);
          if (RVar4 == 0) {
            uVar5 = ref_node_tri_area(ref_node,local_b8,&local_188);
            uVar6 = ref_node_tri_grad_nodes(ref_node,local_b8,local_180,local_168);
            if (uVar5 == 0 && uVar6 == 0) {
              lVar8 = 0;
              do {
                iVar2 = local_b8[lVar8];
                lVar12 = 0;
                do {
                  grad[(long)iVar2 * 3 + lVar12] =
                       local_168[lVar12] * local_188 + grad[(long)iVar2 * 3 + lVar12];
                  lVar12 = lVar12 + 1;
                } while (lVar12 != 3);
                lVar8 = lVar8 + 1;
              } while (lVar8 != 3);
              lVar8 = 0;
              do {
                *(double *)((long)unaff_RBX + (long)local_b8[lVar8] * 8) =
                     *(double *)((long)unaff_RBX + (long)local_b8[lVar8] * 8) + local_188;
                lVar8 = lVar8 + 1;
              } while (lVar8 != 3);
            }
            else {
              printf("%s: %d: %s: vol status %d grad status %d\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x44,"ref_recon_l2_projection_grad",(ulong)uVar5,(ulong)uVar6);
            }
          }
          iVar16 = iVar16 + 1;
          pRVar14 = local_130->cell[3];
        } while (iVar16 < pRVar14->max);
      }
      pRVar14 = local_130->cell[6];
      if (0 < pRVar14->max) {
        RVar15 = 0;
        pRVar17 = local_130;
        do {
          RVar4 = ref_cell_nodes(pRVar14,RVar15,local_128);
          if (RVar4 == 0) {
            local_b8[0] = local_128[0];
            local_b8[3] = uStack_118;
            uVar5 = ref_node_tri_area(ref_node,local_b8,&local_188);
            uVar6 = ref_node_tri_grad_nodes(ref_node,local_b8,local_180,local_168);
            if (uVar5 == 0 && uVar6 == 0) {
              lVar8 = 0;
              do {
                iVar16 = local_b8[lVar8];
                lVar12 = 0;
                do {
                  grad[(long)iVar16 * 3 + lVar12] =
                       local_168[lVar12] * local_188 + grad[(long)iVar16 * 3 + lVar12];
                  lVar12 = lVar12 + 1;
                } while (lVar12 != 3);
                lVar8 = lVar8 + 1;
              } while (lVar8 != 3);
              lVar8 = 0;
              do {
                *(double *)((long)unaff_RBX + (long)local_b8[lVar8] * 8) =
                     *(double *)((long)unaff_RBX + (long)local_b8[lVar8] * 8) + local_188;
                lVar8 = lVar8 + 1;
              } while (lVar8 != 3);
            }
            else {
              printf("%s: %d: %s: vol status %d grad status %d\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x57,"ref_recon_l2_projection_grad",(ulong)uVar5,(ulong)uVar6);
            }
            local_b8[0] = local_128[0];
            local_b8[1] = local_128[2];
            uVar5 = ref_node_tri_area(ref_node,local_b8,&local_188);
            uVar6 = ref_node_tri_grad_nodes(ref_node,local_b8,local_180,local_168);
            if (uVar5 == 0 && uVar6 == 0) {
              lVar8 = 0;
              do {
                iVar16 = local_b8[lVar8];
                lVar12 = 0;
                do {
                  grad[(long)iVar16 * 3 + lVar12] =
                       local_168[lVar12] * local_188 + grad[(long)iVar16 * 3 + lVar12];
                  lVar12 = lVar12 + 1;
                } while (lVar12 != 3);
                lVar8 = lVar8 + 1;
              } while (lVar8 != 3);
              lVar8 = 0;
              do {
                *(double *)((long)unaff_RBX + (long)local_b8[lVar8] * 8) =
                     *(double *)((long)unaff_RBX + (long)local_b8[lVar8] * 8) + local_188;
                lVar8 = lVar8 + 1;
                pRVar17 = local_130;
              } while (lVar8 != 3);
            }
            else {
              printf("%s: %d: %s: vol status %d grad status %d\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x67,"ref_recon_l2_projection_grad",(ulong)uVar5,(ulong)uVar6);
              pRVar17 = local_130;
            }
          }
          RVar15 = RVar15 + 1;
          pRVar14 = pRVar17->cell[6];
        } while (RVar15 < pRVar14->max);
      }
    }
    local_144 = 0;
    if (0 < ref_node->max) {
      lVar8 = 0;
      pRVar18 = grad;
      do {
        if (-1 < ref_node->global[lVar8]) {
          dVar1 = *(double *)((long)unaff_RBX + lVar8 * 8);
          dVar19 = dVar1 * 1e+20;
          if (dVar19 <= -dVar19) {
            dVar19 = -dVar19;
          }
          dVar20 = grad[lVar8 * 3];
          if (dVar20 <= -dVar20) {
            dVar20 = -dVar20;
          }
          if (dVar20 < dVar19) {
            dVar20 = grad[lVar8 * 3 + 1];
            if (dVar20 <= -dVar20) {
              dVar20 = -dVar20;
            }
            if (dVar20 < dVar19) {
              dVar20 = grad[lVar8 * 3 + 2];
              if (dVar20 <= -dVar20) {
                dVar20 = -dVar20;
              }
              if (dVar20 < dVar19) {
                lVar12 = 0;
                do {
                  pRVar18[lVar12] = pRVar18[lVar12] / dVar1;
                  lVar12 = lVar12 + 1;
                } while (lVar12 != 3);
                goto LAB_001e9685;
              }
            }
          }
          puVar9 = (undefined8 *)((lVar8 * 0x18 & 0x7fffffff8U) + (long)grad);
          local_144 = 1;
          *puVar9 = 0;
          puVar9[1] = 0;
          puVar9[2] = 0;
          printf("%s: %d: %s: total vol %e, ignored\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x16b,"ref_recon_l2_projection_grad");
        }
LAB_001e9685:
        lVar8 = lVar8 + 1;
        pRVar18 = pRVar18 + 3;
        ref_node = local_138;
      } while (lVar8 < local_138->max);
    }
    uVar5 = ref_mpi_all_or(local_130->mpi,&local_144);
    if (uVar5 == 0) {
      uVar5 = ref_node_ghost_dbl(local_138,grad,3);
      if (uVar5 == 0) {
        if (unaff_RBX != (void *)0x0) {
          free(unaff_RBX);
        }
        uVar5 = (uint)(local_144 != 0) << 2;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x170,"ref_recon_l2_projection_grad",(ulong)uVar5,"update ghosts");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x16f
             ,"ref_recon_l2_projection_grad",(ulong)uVar5,"mpi all or");
    }
  }
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_recon_l2_projection_grad(REF_GRID ref_grid,
                                                REF_DBL *scalar,
                                                REF_DBL *grad) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT i, node, cell, group, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER], tet_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT pri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT qua_nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL div_by_zero;
  REF_DBL cell_vol, cell_grad[3];
  REF_DBL *vol;
  REF_STATUS vol_status, grad_status;

  ref_malloc_init(vol, ref_node_max(ref_node), REF_DBL, 0.0);

  each_ref_node_valid_node(ref_node, node) for (i = 0; i < 3; i++)
      grad[i + 3 * node] = 0.0;

  if (ref_grid_twod(ref_grid)) {
    each_ref_cell_valid_cell_with_nodes(ref_grid_tri(ref_grid), cell, nodes) {
      vol_status = ref_node_tri_area(ref_node, nodes, &cell_vol);
      grad_status = ref_node_tri_grad_nodes(ref_node, nodes, scalar, cell_grad);
      if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
        for (cell_node = 0; cell_node < 3; cell_node++)
          for (i = 0; i < 3; i++)
            grad[i + 3 * nodes[cell_node]] += cell_vol * cell_grad[i];
        for (cell_node = 0; cell_node < 3; cell_node++)
          vol[nodes[cell_node]] += cell_vol;
      } else {
        printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__, __LINE__,
               __func__, vol_status, grad_status);
      }
    }
    each_ref_cell_valid_cell_with_nodes(ref_grid_qua(ref_grid), cell,
                                        qua_nodes) {
      nodes[0] = qua_nodes[0];
      nodes[1] = qua_nodes[1];
      nodes[2] = qua_nodes[2];
      nodes[3] = qua_nodes[4];
      vol_status = ref_node_tri_area(ref_node, nodes, &cell_vol);
      grad_status = ref_node_tri_grad_nodes(ref_node, nodes, scalar, cell_grad);
      if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
        for (cell_node = 0; cell_node < 3; cell_node++)
          for (i = 0; i < 3; i++)
            grad[i + 3 * nodes[cell_node]] += cell_vol * cell_grad[i];
        for (cell_node = 0; cell_node < 3; cell_node++)
          vol[nodes[cell_node]] += cell_vol;
      } else {
        printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__, __LINE__,
               __func__, vol_status, grad_status);
      }
      nodes[0] = qua_nodes[0];
      nodes[1] = qua_nodes[2];
      nodes[2] = qua_nodes[3];
      nodes[3] = qua_nodes[4];
      vol_status = ref_node_tri_area(ref_node, nodes, &cell_vol);
      grad_status = ref_node_tri_grad_nodes(ref_node, nodes, scalar, cell_grad);
      if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
        for (cell_node = 0; cell_node < 3; cell_node++)
          for (i = 0; i < 3; i++)
            grad[i + 3 * nodes[cell_node]] += cell_vol * cell_grad[i];
        for (cell_node = 0; cell_node < 3; cell_node++)
          vol[nodes[cell_node]] += cell_vol;
      } else {
        printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__, __LINE__,
               __func__, vol_status, grad_status);
      }
    }
  } else {
    each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        switch (ref_cell_type(ref_cell)) {
          case REF_CELL_TET:
            vol_status = ref_node_tet_vol(ref_node, nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            break;
          case REF_CELL_PRI:
            tet_nodes[0] = nodes[0];
            tet_nodes[1] = nodes[4];
            tet_nodes[2] = nodes[5];
            tet_nodes[3] = nodes[3];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            tet_nodes[0] = nodes[0];
            tet_nodes[1] = nodes[1];
            tet_nodes[2] = nodes[5];
            tet_nodes[3] = nodes[4];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            tet_nodes[0] = nodes[0];
            tet_nodes[1] = nodes[1];
            tet_nodes[2] = nodes[2];
            tet_nodes[3] = nodes[5];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            break;
          case REF_CELL_PYR:
            tet_nodes[0] = nodes[0];
            tet_nodes[1] = nodes[4];
            tet_nodes[2] = nodes[1];
            tet_nodes[3] = nodes[2];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            tet_nodes[0] = nodes[0];
            tet_nodes[1] = nodes[3];
            tet_nodes[2] = nodes[4];
            tet_nodes[3] = nodes[2];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            break;
          case REF_CELL_HEX:

            pri_nodes[0] = nodes[1];
            pri_nodes[1] = nodes[0];
            pri_nodes[2] = nodes[4];
            pri_nodes[3] = nodes[2];
            pri_nodes[4] = nodes[3];
            pri_nodes[5] = nodes[7];

            tet_nodes[0] = pri_nodes[0];
            tet_nodes[1] = pri_nodes[4];
            tet_nodes[2] = pri_nodes[5];
            tet_nodes[3] = pri_nodes[3];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            tet_nodes[0] = pri_nodes[0];
            tet_nodes[1] = pri_nodes[1];
            tet_nodes[2] = pri_nodes[5];
            tet_nodes[3] = pri_nodes[4];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            tet_nodes[0] = pri_nodes[0];
            tet_nodes[1] = pri_nodes[1];
            tet_nodes[2] = pri_nodes[2];
            tet_nodes[3] = pri_nodes[5];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }

            pri_nodes[0] = nodes[1];
            pri_nodes[1] = nodes[4];
            pri_nodes[2] = nodes[5];
            pri_nodes[3] = nodes[2];
            pri_nodes[4] = nodes[7];
            pri_nodes[5] = nodes[6];

            tet_nodes[1] = pri_nodes[4];
            tet_nodes[2] = pri_nodes[5];
            tet_nodes[3] = pri_nodes[3];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            tet_nodes[0] = pri_nodes[0];
            tet_nodes[1] = pri_nodes[1];
            tet_nodes[2] = pri_nodes[5];
            tet_nodes[3] = pri_nodes[4];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            tet_nodes[0] = pri_nodes[0];
            tet_nodes[1] = pri_nodes[1];
            tet_nodes[2] = pri_nodes[2];
            tet_nodes[3] = pri_nodes[5];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }

            break;
          case REF_CELL_EDG:
          case REF_CELL_ED2:
          case REF_CELL_ED3:
          case REF_CELL_TRI:
          case REF_CELL_TR2:
          case REF_CELL_TR3:
          case REF_CELL_QUA:
          case REF_CELL_QU2:
          case REF_CELL_TE2:
          case REF_CELL_PY2:
          case REF_CELL_PR2:
          case REF_CELL_HE2:
            RSB(REF_IMPLEMENT, "implement cell type",
                { printf("unknown type %d\n", (int)ref_cell_type(ref_cell)); });
        }
      }
    }
  }

  div_by_zero = REF_FALSE;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_math_divisible(grad[0 + 3 * node], vol[node]) &&
        ref_math_divisible(grad[1 + 3 * node], vol[node]) &&
        ref_math_divisible(grad[2 + 3 * node], vol[node])) {
      for (i = 0; i < 3; i++) grad[i + 3 * node] /= vol[node];
    } else {
      div_by_zero = REF_TRUE;
      for (i = 0; i < 3; i++) grad[i + 3 * node] = 0.0;
      printf("%s: %d: %s: total vol %e, ignored\n", __FILE__, __LINE__,
             __func__, vol[node]);
    }
  }
  RSS(ref_mpi_all_or(ref_grid_mpi(ref_grid), &div_by_zero), "mpi all or");
  RSS(ref_node_ghost_dbl(ref_node, grad, 3), "update ghosts");

  ref_free(vol);

  return (div_by_zero ? REF_DIV_ZERO : REF_SUCCESS);
}